

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_cipher_context_t * ptls_cipher_new(ptls_cipher_algorithm_t *algo,int is_enc,void *key)

{
  int iVar1;
  ptls_cipher_context_t *__ptr;
  
  __ptr = (ptls_cipher_context_t *)malloc(algo->context_size);
  if (__ptr != (ptls_cipher_context_t *)0x0) {
    __ptr->algo = algo;
    __ptr->do_dispose = (_func_void_st_ptls_cipher_context_t_ptr *)0x0;
    __ptr->do_init = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0;
    __ptr->do_transform = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    iVar1 = (*algo->setup_crypto)(__ptr,is_enc,key);
    if (iVar1 == 0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ptls_cipher_context_t *)0x0;
}

Assistant:

ptls_cipher_context_t *ptls_cipher_new(ptls_cipher_algorithm_t *algo, int is_enc, const void *key)
{
    ptls_cipher_context_t *ctx;

    if ((ctx = (ptls_cipher_context_t *)malloc(algo->context_size)) == NULL)
        return NULL;
    *ctx = (ptls_cipher_context_t){algo};
    if (algo->setup_crypto(ctx, is_enc, key) != 0) {
        free(ctx);
        ctx = NULL;
    }
    return ctx;
}